

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cor_broker.cpp
# Opt level: O3

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  Creature goblin;
  Game g;
  DoubleAttackModifier dam;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  size_type local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  Creature local_88;
  signal<void_(Query_&),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(Query_&)>,_boost::function<void_(const_boost::signals2::connection_&,_Query_&)>,_boost::signals2::mutex>
  local_58;
  DoubleAttackModifier local_40;
  
  boost::signals2::
  signal<void_(Query_&),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(Query_&)>,_boost::function<void_(const_boost::signals2::connection_&,_Query_&)>,_boost::signals2::mutex>
  ::signal(&local_58,(int)&local_88,(__sighandler_t)&local_40);
  local_a8 = &local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Goblin","");
  paVar1 = &local_88.name.field_2;
  local_88.m_attack = 2;
  local_88.m_defense = 2;
  if (local_a8 == &local_98) {
    local_88.name.field_2._8_8_ = local_98._8_8_;
    local_88.name._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_88.name._M_dataplus._M_p = (pointer)local_a8;
  }
  local_88.name.field_2._M_allocated_capacity._1_7_ = local_98._M_allocated_capacity._1_7_;
  local_88.name.field_2._M_local_buf[0] = local_98._M_local_buf[0];
  local_88.name._M_string_length = local_a0;
  local_a0 = 0;
  local_98._M_local_buf[0] = '\0';
  local_a8 = &local_98;
  local_88.m_game._M_data = (Game *)&local_58;
  poVar2 = operator<<((ostream *)&std::cout,&local_88);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  DoubleAttackModifier::DoubleAttackModifier(&local_40,(Game *)&local_58,&local_88);
  poVar2 = operator<<((ostream *)&std::cout,&local_88);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  DoubleAttackModifier::~DoubleAttackModifier(&local_40);
  poVar2 = operator<<((ostream *)&std::cout,&local_88);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_88.name._M_dataplus._M_p,local_88.name.field_2._M_allocated_capacity + 1);
  }
  local_58.super_signal_base._vptr_signal_base = (_func_int **)&PTR__signal_00110be8;
  boost::detail::shared_count::~shared_count(&local_58._pimpl.pn);
  return 0;
}

Assistant:

int main()
{
	Game g{};
	Creature goblin{g, "Goblin", 2, 2};
	std::cout << goblin << std::endl;

	{
		DoubleAttackModifier dam{g, goblin};
		std::cout << goblin << std::endl;
	}

	std::cout << goblin << std::endl;
	return 0;
}